

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O1

void blake224_init(state_conflict *S)

{
  S->h[0] = 0xc1059ed8;
  S->h[1] = 0x367cd507;
  S->h[2] = 0x3070dd17;
  S->h[3] = 0xf70e5939;
  S->h[4] = 0xffc00b31;
  S->h[5] = 0x68581511;
  S->h[6] = 0x64f98fa7;
  S->h[7] = 0xbefa4fa4;
  S->s[0] = 0;
  S->s[1] = 0;
  S->s[2] = 0;
  S->s[3] = 0;
  S->t[0] = 0;
  S->t[1] = 0;
  S->buflen = 0;
  S->nullt = 0;
  return;
}

Assistant:

void blake224_init(state *S) {
    S->h[0] = 0xC1059ED8;
    S->h[1] = 0x367CD507;
    S->h[2] = 0x3070DD17;
    S->h[3] = 0xF70E5939;
    S->h[4] = 0xFFC00B31;
    S->h[5] = 0x68581511;
    S->h[6] = 0x64F98FA7;
    S->h[7] = 0xBEFA4FA4;
    S->t[0] = S->t[1] = S->buflen = S->nullt = 0;
    S->s[0] = S->s[1] = S->s[2] = S->s[3] = 0;
}